

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

bool __thiscall QMap<QString,_QVariant>::contains(QMap<QString,_QVariant> *this,QString *key)

{
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  bool bVar3;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    bVar3 = false;
  }
  else {
    cVar2 = std::
            _Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
            ::find((_Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
                    *)(pQVar1 + 8),key);
    bVar3 = cVar2._M_node != (_Base_ptr)((this->d).d.ptr + 0x10);
  }
  return bVar3;
}

Assistant:

bool contains(const Key &key) const
    {
        if (!d)
            return false;
        auto i = d->m.find(key);
        return i != d->m.end();
    }